

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O1

uint32_t __thiscall mjs::bound_function_args::bound_args_len(bound_function_args *this)

{
  gc_vector<mjs::value_representation> *pgVar1;
  gc_table *pgVar2;
  
  if ((this->bound_args_).pos_ != 0) {
    pgVar1 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>,_true>::dereference
                       (&this->bound_args_,this->heap_);
    pgVar2 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>::gc_table,_true>::
             dereference(&pgVar1->table_,pgVar1->heap_);
    return pgVar2->length_;
  }
  return 0;
}

Assistant:

explicit operator bool() const { return pos_; }